

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_ldst_pair(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int base,int16_t offset)

{
  int iVar1;
  TCGContext_conflict6 *s;
  TCGContext_conflict6 *pTVar2;
  TCGTemp *pTVar3;
  TCGv_i64 a2;
  TCGOpcode opc_00;
  MemOp_conflict2 MVar4;
  uintptr_t o_2;
  TCGv_i64 addr;
  uintptr_t o_1;
  TCGv_i64 val;
  
  if ((rd == 0x1f) || ((ctx->hflags & 0x87f800) != 0)) {
LAB_009b167c:
    generate_exception_err(ctx,0x14,0);
    return;
  }
  s = ctx->uc->tcg_ctx;
  pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  addr = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  val = (TCGv_i64)((long)pTVar3 - (long)s);
  gen_base_offset_addr(ctx,addr,base,(int)offset);
  if ((int)opc < 9) {
    if (opc == 1) {
      if (rd == base) goto LAB_009b167c;
      tcg_gen_qemu_ld_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_LESL);
      if ((rd != 0) && (s->cpu_gpr[rd] != val)) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[rd] + (long)s),(TCGArg)pTVar3);
      }
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,4);
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op3_mips64el
                (pTVar2,INDEX_op_add_i64,(TCGArg)((long)pTVar2 + (long)addr),
                 (TCGArg)((long)pTVar2 + (long)addr),(TCGArg)((long)pTVar2 + (long)val));
      if ((ctx->hflags & 0x200) != 0) {
        tcg_gen_ext32s_i64_mips64el(pTVar2,addr,addr);
      }
      iVar1 = ctx->mem_idx;
      MVar4 = MO_LESL;
    }
    else {
      if (opc != 4) goto LAB_009b1964;
      if (rd == base) goto LAB_009b167c;
      tcg_gen_qemu_ld_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_64);
      if ((rd != 0) && (s->cpu_gpr[rd] != val)) {
        tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[rd] + (long)s),(TCGArg)pTVar3);
      }
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,8);
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op3_mips64el
                (pTVar2,INDEX_op_add_i64,(TCGArg)((long)pTVar2 + (long)addr),
                 (TCGArg)((long)pTVar2 + (long)addr),(TCGArg)((long)pTVar2 + (long)val));
      if ((ctx->hflags & 0x200) != 0) {
        tcg_gen_ext32s_i64_mips64el(pTVar2,addr,addr);
      }
      iVar1 = ctx->mem_idx;
      MVar4 = MO_64;
    }
    tcg_gen_qemu_ld_i64_mips64el(s,val,addr,(long)iVar1,MVar4);
    if (s->cpu_gpr[(long)rd + 1] != val) {
      tcg_gen_op2_mips64el
                (s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[(long)rd + 1] + (long)s),(TCGArg)pTVar3);
    }
    goto LAB_009b1964;
  }
  if (opc == 9) {
    if (rd == 0) {
      tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,0);
    }
    else if (s->cpu_gpr[rd] != val) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)pTVar3,(TCGArg)(s->cpu_gpr[rd] + (long)s));
    }
    tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_32);
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,4);
    pTVar2 = ctx->uc->tcg_ctx;
    tcg_gen_op3_mips64el
              (pTVar2,INDEX_op_add_i64,(TCGArg)((long)pTVar2 + (long)addr),
               (TCGArg)((long)pTVar2 + (long)addr),(TCGArg)((long)pTVar2 + (long)val));
    if ((ctx->hflags & 0x200) != 0) {
      tcg_gen_ext32s_i64_mips64el(pTVar2,addr,addr);
    }
    if (s->cpu_gpr[(long)rd + 1] != val) {
      tcg_gen_op2_mips64el
                (s,INDEX_op_mov_i64,(TCGArg)pTVar3,(TCGArg)(s->cpu_gpr[(long)rd + 1] + (long)s));
    }
    iVar1 = ctx->mem_idx;
    MVar4 = MO_32;
  }
  else {
    if (opc != 0xc) goto LAB_009b1964;
    if (rd == 0) {
      opc_00 = INDEX_op_movi_i64;
      a2 = (TCGv_i64)0x0;
LAB_009b17e4:
      tcg_gen_op2_mips64el(s,opc_00,(TCGArg)pTVar3,(TCGArg)a2);
    }
    else if (s->cpu_gpr[rd] != val) {
      a2 = s->cpu_gpr[rd] + (long)s;
      opc_00 = INDEX_op_mov_i64;
      goto LAB_009b17e4;
    }
    tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)ctx->mem_idx,MO_64);
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)pTVar3,8);
    pTVar2 = ctx->uc->tcg_ctx;
    tcg_gen_op3_mips64el
              (pTVar2,INDEX_op_add_i64,(TCGArg)((long)pTVar2 + (long)addr),
               (TCGArg)((long)pTVar2 + (long)addr),(TCGArg)((long)pTVar2 + (long)val));
    if ((ctx->hflags & 0x200) != 0) {
      tcg_gen_ext32s_i64_mips64el(pTVar2,addr,addr);
    }
    if (s->cpu_gpr[(long)rd + 1] != val) {
      tcg_gen_op2_mips64el
                (s,INDEX_op_mov_i64,(TCGArg)pTVar3,(TCGArg)(s->cpu_gpr[(long)rd + 1] + (long)s));
    }
    iVar1 = ctx->mem_idx;
    MVar4 = MO_64;
  }
  tcg_gen_qemu_st_i64_mips64el(s,val,addr,(long)iVar1,MVar4);
LAB_009b1964:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(addr + (long)s));
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(val + (long)s));
  return;
}

Assistant:

static void gen_ldst_pair(DisasContext *ctx, uint32_t opc, int rd,
                          int base, int16_t offset)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0, t1;

    if (ctx->hflags & MIPS_HFLAG_BMASK || rd == 31) {
        generate_exception_end(ctx, EXCP_RI);
        return;
    }

    t0 = tcg_temp_new(tcg_ctx);
    t1 = tcg_temp_new(tcg_ctx);

    gen_base_offset_addr(ctx, t0, base, offset);

    switch (opc) {
    case LWP:
        if (rd == base) {
            generate_exception_end(ctx, EXCP_RI);
            return;
        }
        tcg_gen_qemu_ld_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TESL);
        gen_store_gpr(tcg_ctx, t1, rd);
        tcg_gen_movi_tl(tcg_ctx, t1, 4);
        gen_op_addr_add(ctx, t0, t0, t1);
        tcg_gen_qemu_ld_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TESL);
        gen_store_gpr(tcg_ctx, t1, rd + 1);
        break;
    case SWP:
        gen_load_gpr(tcg_ctx, t1, rd);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEUL);
        tcg_gen_movi_tl(tcg_ctx, t1, 4);
        gen_op_addr_add(ctx, t0, t0, t1);
        gen_load_gpr(tcg_ctx, t1, rd + 1);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEUL);
        break;
#ifdef TARGET_MIPS64
    case LDP:
        if (rd == base) {
            generate_exception_end(ctx, EXCP_RI);
            return;
        }
        tcg_gen_qemu_ld_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEQ);
        gen_store_gpr(tcg_ctx, t1, rd);
        tcg_gen_movi_tl(tcg_ctx, t1, 8);
        gen_op_addr_add(ctx, t0, t0, t1);
        tcg_gen_qemu_ld_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEQ);
        gen_store_gpr(tcg_ctx, t1, rd + 1);
        break;
    case SDP:
        gen_load_gpr(tcg_ctx, t1, rd);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEQ);
        tcg_gen_movi_tl(tcg_ctx, t1, 8);
        gen_op_addr_add(ctx, t0, t0, t1);
        gen_load_gpr(tcg_ctx, t1, rd + 1);
        tcg_gen_qemu_st_tl(tcg_ctx, t1, t0, ctx->mem_idx, MO_TEQ);
        break;
#endif
    }
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}